

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O1

void __thiscall HDual::iz_dvx_fwk(HDual *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  if (0 < this->numTot) {
    piVar2 = (this->dvx_ix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->model->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      piVar2[lVar6] = (uint)(piVar3[lVar6] == 0);
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->numTot);
  }
  auVar5 = _DAT_001570a0;
  iVar1 = this->numRow;
  if (0 < (long)iVar1) {
    pdVar4 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = (long)iVar1 + -1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar7 = auVar7 ^ _DAT_001570a0;
    auVar8 = _DAT_00157090;
    do {
      auVar10 = auVar8 ^ auVar5;
      if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                  auVar7._4_4_ < auVar10._4_4_) & 1)) {
        *(undefined8 *)((long)pdVar4 + lVar6) = 0x3ff0000000000000;
      }
      if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
          auVar10._12_4_ <= auVar7._12_4_) {
        *(undefined8 *)((long)pdVar4 + lVar6 + 8) = 0x3ff0000000000000;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar6);
  }
  this->n_dvx_it = 0;
  this->n_dvx_fwk = this->n_dvx_fwk + 1;
  this->nw_dvx_fwk = false;
  return;
}

Assistant:

void HDual::iz_dvx_fwk() {
//Initialise the Devex framework: reference set is all basic variables
	for (int vr_n = 0; vr_n < numTot; vr_n++) {
		if (model->getNonbasicFlag()[vr_n])
			//			Nonbasic variables not in reference set
			dvx_ix[vr_n] = dvx_not_in_R;
		else
			//			Basic variables in reference set
			dvx_ix[vr_n] = dvx_in_R;
	}
	for (int i = 0; i < numRow; i++)
		dualRHS.workEdWt[i] = 1.0;
	n_dvx_it = 0;
	n_dvx_fwk += 1;
	nw_dvx_fwk = false;
}